

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall
Parser::Parser(Parser *this,ScriptContext *scriptContext,BOOL strictMode,PageAllocator *alloc,
              bool isBackground,size_t size)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *this_00;
  TempGuestArenaAllocatorObject *ptr;
  Recycler *recycler;
  TempArenaAllocatorWrapper<true> *this_01;
  ArenaAllocator *allocator;
  undefined4 *puVar3;
  PageAllocator *local_58;
  size_t size_local;
  bool isBackground_local;
  PageAllocator *alloc_local;
  BOOL strictMode_local;
  ScriptContext *scriptContext_local;
  Parser *this_local;
  
  local_58 = alloc;
  if (alloc == (PageAllocator *)0x0) {
    this_00 = Js::ScriptContext::GetThreadContext(scriptContext);
    local_58 = ThreadContext::GetPageAllocator(this_00);
  }
  Memory::ArenaAllocator::ArenaAllocator
            (&this->m_nodeAllocator,L"Parser",local_58,OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  this->m_cactIdentToNodeLookup = 0;
  this->m_grfscr = 0;
  this->m_length = 0;
  this->m_originalLength = 0;
  this->m_nextFunctionId = (LocalFunctionId *)0x0;
  this->m_sourceContextInfo = (SourceContextInfo *)0x0;
  this->m_hasParallelJob = false;
  this->m_isInBackground = isBackground;
  this->m_doingFastScan = false;
  this->m_tempGuestArenaReleased = false;
  this->m_nextBlockId = 0;
  ptr = Js::ScriptContext::GetTemporaryGuestAllocator(scriptContext,L"ParserRegex");
  recycler = Js::ScriptContext::GetRecycler(scriptContext);
  Memory::AutoRecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>::AutoRecyclerRootPtr
            (&this->m_tempGuestArena,ptr,recycler);
  this_01 = Memory::RecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>::operator->
                      (&(this->m_tempGuestArena).
                        super_RecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>);
  allocator = Js::TempArenaAllocatorWrapper<true>::GetAllocator(this_01);
  SList<UnifiedRegex::RegexPattern_*,_Memory::ArenaAllocator,_RealCount>::SList
            (&this->m_registeredRegexPatterns,allocator);
  this->m_scriptContext = scriptContext;
  Token::Token((Token *)&this->m_token);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scanner(&this->m_scan,this,&this->m_token,scriptContext);
  this->m_currentNodeNonLambdaFunc = (ParseNodeFnc *)0x0;
  this->m_currentNodeNonLambdaDeferredFunc = (ParseNodeFnc *)0x0;
  this->m_currentNodeFunc = (ParseNodeFnc *)0x0;
  this->m_currentNodeDeferredFunc = (ParseNodeFnc *)0x0;
  this->m_currentNodeProg = (ParseNodeProg *)0x0;
  this->m_currDeferredStub = (DeferredFunctionStub *)0x0;
  this->m_currDeferredStubCount = 0;
  this->m_pCurrentAstSize = (int32 *)0x0;
  this->m_ppnodeScope = (ParseNodePtr *)0x0;
  this->m_ppnodeExprScope = (ParseNodePtr *)0x0;
  this->m_ppnodeVar = (ParseNodePtr *)0x0;
  this->m_inDeferredNestedFunc = false;
  this->m_reparsingLambdaParams = false;
  this->m_disallowImportExportStmt = false;
  this->m_isInParsingArgList = false;
  this->m_hasDestructuringPattern = false;
  this->m_hasDeferredShorthandInitError = false;
  this->m_deferEllipsisError = false;
  this->m_deferCommaError = false;
  this->m_pnestedCount = (uint *)0x0;
  (this->wellKnownPropertyPids)._superConstructor = (IdentPtr)0x0;
  (this->wellKnownPropertyPids)._importMeta = (IdentPtr)0x0;
  (this->wellKnownPropertyPids)._newTarget = (IdentPtr)0x0;
  (this->wellKnownPropertyPids)._super = (IdentPtr)0x0;
  (this->wellKnownPropertyPids)._star = (IdentPtr)0x0;
  (this->wellKnownPropertyPids)._this = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).meta = (IdentPtr)0x0;
  (this->wellKnownPropertyPids)._default = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).from = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).as = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).of = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).target = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).prototype = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).__proto__ = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).await = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).constructor = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).get = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).let = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).eval = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).set = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).arguments = (IdentPtr)0x0;
  (this->wellKnownPropertyPids).async = (IdentPtr)0x0;
  this->m_sourceLim = 0;
  this->m_functionBody = (ParseableFunctionInfo *)0x0;
  this->m_parseType = ParseType_Upfront;
  this->m_arrayDepth = 0;
  this->m_funcInArrayDepth = 0;
  this->m_funcInArray = 0;
  this->m_scopeCountNoAst = 0;
  this->m_funcParenExprDepth = 0;
  RestorePoint::RestorePoint(&this->m_deferEllipsisErrorLoc);
  RestorePoint::RestorePoint(&this->m_deferCommaErrorLoc);
  this->m_tryCatchOrFinallyDepth = 0;
  this->m_pstmtCur = (StmtNest *)0x0;
  this->m_currentBlockInfo = (BlockInfoStack *)0x0;
  this->m_currentScope = (Scope *)0x0;
  this->currBackgroundParseItem = (BackgroundParseItem *)0x0;
  this->backgroundParseItems = (BackgroundParseItem *)0x0;
  this->fastScannedRegExpNodes = (NodeDList *)0x0;
  this->m_currentDynamicBlock = (BlockIdsStack *)0x0;
  this->m_UsesArgumentsAtGlobal = false;
  this->m_fUseStrictMode = strictMode;
  this->m_InAsmMode = false;
  this->m_deferAsmJs = true;
  this->m_fExpectExternalSource = 0;
  this->m_deferringAST = 0;
  this->m_stoppedDeferredParse = 0;
  if (size != 0xaa8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x7a,"(size == sizeof(Parser))",
                       "verify conditionals affecting the size of Parser agree");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x7b,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  InitPids(this);
  return;
}

Assistant:

Parser::Parser(Js::ScriptContext* scriptContext, BOOL strictMode, PageAllocator *alloc, bool isBackground)
#endif
    : m_nodeAllocator(_u("Parser"), alloc ? alloc : scriptContext->GetThreadContext()->GetPageAllocator(), Parser::OutOfMemory),
    m_cactIdentToNodeLookup(0),
    m_grfscr(fscrNil),
    m_length(0),
    m_originalLength(0),
    m_nextFunctionId(nullptr),
    m_sourceContextInfo(nullptr),
#if ENABLE_BACKGROUND_PARSING
    m_isInBackground(isBackground),
    m_hasParallelJob(false),
    m_doingFastScan(false),
#endif
    m_nextBlockId(0),
    m_tempGuestArenaReleased(false),
    m_tempGuestArena(scriptContext->GetTemporaryGuestAllocator(_u("ParserRegex")), scriptContext->GetRecycler()),
    // use the GuestArena directly for keeping the RegexPattern* alive during byte code generation
    m_registeredRegexPatterns(m_tempGuestArena->GetAllocator()),

    m_scriptContext(scriptContext),
    m_token(), // should initialize to 0/nullptrs
    m_scan(this, &m_token, scriptContext),

    m_currentNodeNonLambdaFunc(nullptr),
    m_currentNodeNonLambdaDeferredFunc(nullptr),
    m_currentNodeFunc(nullptr),
    m_currentNodeDeferredFunc(nullptr),
    m_currentNodeProg(nullptr),
    m_currDeferredStub(nullptr),
    m_currDeferredStubCount(0),
    m_pCurrentAstSize(nullptr),
    m_ppnodeScope(nullptr),
    m_ppnodeExprScope(nullptr),
    m_ppnodeVar(nullptr),
    m_inDeferredNestedFunc(false),
    m_reparsingLambdaParams(false),
    m_disallowImportExportStmt(false),
    m_isInParsingArgList(false),
    m_hasDestructuringPattern(false),
    m_hasDeferredShorthandInitError(false),
    m_deferCommaError(false),
    m_pnestedCount(nullptr),

    wellKnownPropertyPids(), // should initialize to nullptrs
    m_sourceLim(0),
    m_functionBody(nullptr),
    m_parseType(ParseType_Upfront),

    m_arrayDepth(0),
    m_funcInArrayDepth(0),
    m_funcInArray(0),
    m_scopeCountNoAst(0),

    m_funcParenExprDepth(0),
    m_deferEllipsisError(false),
    m_deferEllipsisErrorLoc(), // calls default initializer
    m_deferCommaErrorLoc(),
    m_tryCatchOrFinallyDepth(0),

    m_pstmtCur(nullptr),
    m_currentBlockInfo(nullptr),
    m_currentScope(nullptr),

    currBackgroundParseItem(nullptr),
    backgroundParseItems(nullptr),
    fastScannedRegExpNodes(nullptr),

    m_currentDynamicBlock(nullptr),

    m_UsesArgumentsAtGlobal(false),

    m_fUseStrictMode(strictMode),
    m_InAsmMode(false),
    m_deferAsmJs(true),
    m_fExpectExternalSource(FALSE),
    m_deferringAST(FALSE),
    m_stoppedDeferredParse(FALSE)
{
    AssertMsg(size == sizeof(Parser), "verify conditionals affecting the size of Parser agree");
    Assert(scriptContext != nullptr);

    // init PID members
    InitPids();
}